

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Ramp.cpp
# Opt level: O3

void __thiscall chrono::ChFunction_Ramp::ArchiveOUT(ChFunction_Ramp *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Ramp>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_30 = &this->y0;
  local_38 = "y0";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->ang;
  local_38 = "ang";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Ramp::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Ramp>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(y0);
    marchive << CHNVP(ang);
}